

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedProcedure.cpp
# Opt level: O0

void __thiscall
slang::analysis::AnalyzedProcedure::AnalyzedProcedure
          (AnalyzedProcedure *this,AnalysisContext *context,Symbol *analyzedSymbol,
          AnalyzedProcedure *parentProcedure)

{
  SourceLocation location;
  SourceLocation location_00;
  string_view arg;
  string_view arg_00;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  Symbol *pSVar6;
  ProceduralCheckerStatement *pPVar7;
  reference ppSVar8;
  ProceduralBlockSymbol *pPVar9;
  SubroutineSymbol *pSVar10;
  AnalysisContext *this_00;
  Symbol *in_RCX;
  Symbol *in_RDX;
  not_null<const_slang::ast::Symbol_*> *in_RDI;
  span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>
  sVar11;
  span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>
  sVar12;
  SubroutineSymbol *subroutine;
  ProceduralBlockSymbol *procedure;
  CallExpression *call;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::CallExpression_*const,_18446744073709551615UL> *__range4;
  Expression *expr;
  Symbol *inst;
  iterator __end6;
  iterator __begin6;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *__range6;
  Statement *stmt;
  add_pointer_t<const_slang::ast::Statement_*const> stmtPtr;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *var;
  iterator __end3;
  iterator __begin3;
  span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>
  *__range3;
  Symbol *defaultClocking;
  Scope *scope;
  DataFlowAnalysis dfa;
  span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>
  *in_stack_fffffffffffff148;
  DataFlowAnalysis *in_stack_fffffffffffff150;
  undefined4 in_stack_fffffffffffff158;
  undefined1 in_stack_fffffffffffff15c;
  undefined1 in_stack_fffffffffffff15d;
  undefined1 in_stack_fffffffffffff15e;
  undefined1 in_stack_fffffffffffff15f;
  AnalysisContext *in_stack_fffffffffffff160;
  undefined7 in_stack_fffffffffffff168;
  undefined1 in_stack_fffffffffffff16f;
  TimingControl **in_stack_fffffffffffff170;
  SubroutineSymbol *pSVar13;
  DiagCode code;
  AnalysisContext *in_stack_fffffffffffff178;
  vector<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
  *in_stack_fffffffffffff180;
  Diagnostic *in_stack_fffffffffffff190;
  undefined7 in_stack_fffffffffffff198;
  undefined1 in_stack_fffffffffffff19f;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff1a0;
  Compilation *in_stack_fffffffffffff1a8;
  undefined7 in_stack_fffffffffffff1b0;
  undefined1 in_stack_fffffffffffff1b7;
  ValueSymbol *in_stack_fffffffffffff1c0;
  DataFlowAnalysis *in_stack_fffffffffffff1c8;
  Compilation *in_stack_fffffffffffff1d0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff200;
  Statement *in_stack_fffffffffffff208;
  undefined7 in_stack_fffffffffffff210;
  undefined1 in_stack_fffffffffffff217;
  byte bVar14;
  SubroutineSymbol *in_stack_fffffffffffff218;
  __normal_iterator<const_slang::ast::CallExpression_*const_*,_std::span<const_slang::ast::CallExpression_*const,_18446744073709551615UL>_>
  local_d40;
  span<const_slang::ast::CallExpression_*const,_18446744073709551615UL> local_d38;
  span<const_slang::ast::CallExpression_*const,_18446744073709551615UL> *local_d28;
  Expression *local_d18;
  undefined8 local_d10;
  Symbol *local_d08;
  Symbol **local_d00;
  __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
  local_cf8;
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *local_cf0;
  Statement *local_ce8;
  add_pointer_t<const_slang::ast::Statement_*const> local_ce0;
  reference local_cd8;
  variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *local_cd0;
  __normal_iterator<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_*,_std::span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>_>
  local_cc8;
  span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>
  local_cc0;
  span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>
  *local_cb0;
  DataFlowAnalysis *local_ca8;
  Scope *local_ca0;
  span<const_slang::ast::CallExpression_*const,_18446744073709551615UL> local_c98;
  span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>
  local_c88;
  undefined4 local_c78;
  byte local_c54;
  anon_class_24_3_ec3538fa *in_stack_fffffffffffff3b8;
  DataFlowAnalysis *in_stack_fffffffffffff3c0;
  Symbol *local_28;
  Symbol *local_20;
  Symbol *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  not_null<const_slang::ast::Symbol_*>::not_null<const_slang::ast::Symbol_*>(in_RDI,&local_28);
  in_RDI[1].ptr = local_20;
  in_RDI[2].ptr = (Symbol *)0x0;
  pPVar9 = (ProceduralBlockSymbol *)(in_RDI + 3);
  std::
  vector<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>::
  vector((vector<slang::analysis::AnalyzedAssertion,_std::allocator<slang::analysis::AnalyzedAssertion>_>
          *)0x8144e1);
  DataFlowAnalysis::DataFlowAnalysis
            ((DataFlowAnalysis *)CONCAT17(in_stack_fffffffffffff1b7,in_stack_fffffffffffff1b0),
             (AnalysisContext *)in_stack_fffffffffffff1a8,
             (Symbol *)in_stack_fffffffffffff1a0._M_extent_value,(bool)in_stack_fffffffffffff19f);
  if (local_18->kind == ProceduralBlock) {
    ast::Symbol::as<slang::ast::ProceduralBlockSymbol>((Symbol *)0x814541);
    ast::ProceduralBlockSymbol::getBody(pPVar9);
    AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::run
              ((AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                *)CONCAT17(in_stack_fffffffffffff217,in_stack_fffffffffffff210),
               in_stack_fffffffffffff208);
  }
  else {
    ast::Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x8145ae);
    ast::SubroutineSymbol::getBody(in_stack_fffffffffffff218);
    AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::run
              ((AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
                *)CONCAT17(in_stack_fffffffffffff217,in_stack_fffffffffffff210),
               in_stack_fffffffffffff208);
  }
  sVar11._M_extent._M_extent_value = in_stack_fffffffffffff200._M_extent_value;
  sVar11._M_ptr = (pointer)in_stack_fffffffffffff208;
  if ((local_c54 & 1) != 0) {
    local_c78 = 1;
    goto LAB_00814e68;
  }
  bVar14 = 1;
  if (local_20 == (Symbol *)0x0) {
    sVar11 = DataFlowAnalysis::getAssertions((DataFlowAnalysis *)0x814627);
    local_c88 = sVar11;
    bVar1 = std::
            span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>
            ::empty((span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>
                     *)0x814666);
    bVar14 = 1;
    if (bVar1) {
      local_c98 = DataFlowAnalysis::getSampledValueCalls((DataFlowAnalysis *)0x814685);
      bVar1 = std::span<const_slang::ast::CallExpression_*const,_18446744073709551615UL>::empty
                        ((span<const_slang::ast::CallExpression_*const,_18446744073709551615UL> *)
                         0x8146c4);
      bVar14 = bVar1 ^ 0xff;
    }
  }
  sVar12._M_extent._M_extent_value = in_stack_fffffffffffff1a0._M_extent_value;
  sVar12._M_ptr = (pointer)in_stack_fffffffffffff1a8;
  if ((bVar14 & 1) != 0) {
    if (local_18->kind == ProceduralBlock) {
      pPVar9 = ast::Symbol::as<slang::ast::ProceduralBlockSymbol>((Symbol *)0x8146f7);
      if (pPVar9->procedureKind != Final) {
        pSVar6 = (Symbol *)
                 DataFlowAnalysis::inferClock
                           ((DataFlowAnalysis *)sVar11._M_ptr,
                            (AnalyzedProcedure *)sVar11._M_extent._M_extent_value._M_extent_value);
        in_RDI[2].ptr = pSVar6;
      }
    }
    if (in_RDI[2].ptr == (Symbol *)0x0) {
      local_ca0 = ast::Symbol::getParentScope(local_18);
      in_stack_fffffffffffff1d0 = ast::Scope::getCompilation(local_ca0);
      in_stack_fffffffffffff1c8 =
           (DataFlowAnalysis *)
           ast::Compilation::getDefaultClocking
                     (in_stack_fffffffffffff1a8,(Scope *)in_stack_fffffffffffff1a0._M_extent_value);
      local_ca8 = in_stack_fffffffffffff1c8;
      if (in_stack_fffffffffffff1c8 != (DataFlowAnalysis *)0x0) {
        in_stack_fffffffffffff1c0 =
             (ValueSymbol *)ast::Symbol::as<slang::ast::ClockingBlockSymbol>((Symbol *)0x8147de);
        pSVar6 = (Symbol *)
                 ast::ClockingBlockSymbol::getEvent
                           ((ClockingBlockSymbol *)in_stack_fffffffffffff1d0);
        in_RDI[2].ptr = pSVar6;
      }
    }
    if (in_RDI[2].ptr != (Symbol *)0x0) {
      bVar1 = ast::TimingControl::bad((TimingControl *)in_RDI[2].ptr);
      if (bVar1) {
        local_c78 = 1;
        goto LAB_00814e68;
      }
    }
    sVar12 = DataFlowAnalysis::getAssertions((DataFlowAnalysis *)0x814856);
    local_cb0 = &local_cc0;
    local_cc0 = sVar12;
    local_cc8._M_current =
         (variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *)
         std::
         span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>
         ::begin(in_stack_fffffffffffff148);
    local_cd0 = (variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *)
                std::
                span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>
                ::end((span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>
                       *)CONCAT17(in_stack_fffffffffffff15f,
                                  CONCAT16(in_stack_fffffffffffff15e,
                                           CONCAT15(in_stack_fffffffffffff15d,
                                                    CONCAT14(in_stack_fffffffffffff15c,
                                                             in_stack_fffffffffffff158)))));
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_*,_std::span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>_>
                        ((__normal_iterator<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_*,_std::span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffff150,
                         (__normal_iterator<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_*,_std::span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>_>
                          *)in_stack_fffffffffffff148);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_cd8 = __gnu_cxx::
                  __normal_iterator<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_*,_std::span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>_>
                  ::operator*(&local_cc8);
      local_ce0 = std::
                  get_if<slang::ast::Statement_const*,slang::ast::Statement_const*,slang::ast::Expression_const*>
                            ((variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>
                              *)0x8148f8);
      if (local_ce0 == (add_pointer_t<const_slang::ast::Statement_*const>)0x0) {
        in_stack_fffffffffffff190 =
             (Diagnostic *)
             std::
             get<slang::ast::Expression_const*,slang::ast::Statement_const*,slang::ast::Expression_const*>
                       ((variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*> *)
                        0x814a51);
        local_d18 = (Expression *)
                    (in_stack_fffffffffffff190->args).
                    super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        std::
        vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
        ::
        emplace_back<slang::analysis::AnalysisContext&,slang::ast::TimingControl_const*&,slang::analysis::AnalyzedProcedure*,slang::ast::Symbol_const&,slang::ast::Expression_const&>
                  (in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170,
                   (AnalyzedProcedure **)
                   CONCAT17(in_stack_fffffffffffff16f,in_stack_fffffffffffff168),
                   (Symbol *)in_stack_fffffffffffff160,
                   (Expression *)
                   CONCAT17(in_stack_fffffffffffff15f,
                            CONCAT16(in_stack_fffffffffffff15e,
                                     CONCAT15(in_stack_fffffffffffff15d,
                                              CONCAT14(in_stack_fffffffffffff15c,
                                                       in_stack_fffffffffffff158)))));
      }
      else {
        local_ce8 = *local_ce0;
        if (local_ce8->kind == ProceduralChecker) {
          pPVar7 = ast::Statement::as<slang::ast::ProceduralCheckerStatement>(local_ce8);
          in_stack_fffffffffffff198 = SUB87(pPVar7,0);
          in_stack_fffffffffffff19f = (undefined1)((ulong)pPVar7 >> 0x38);
          local_cf0 = &pPVar7->instances;
          local_cf8._M_current =
               (Symbol **)
               std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::begin
                         ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                          in_stack_fffffffffffff148);
          local_d00 = (Symbol **)
                      std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>::end
                                ((span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                                 CONCAT17(in_stack_fffffffffffff15f,
                                          CONCAT16(in_stack_fffffffffffff15e,
                                                   CONCAT15(in_stack_fffffffffffff15d,
                                                            CONCAT14(in_stack_fffffffffffff15c,
                                                                     in_stack_fffffffffffff158)))));
          while( true ) {
            bVar1 = __gnu_cxx::
                    operator==<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                              ((__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                                *)in_stack_fffffffffffff150,
                               (__normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                                *)in_stack_fffffffffffff148);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            ppSVar8 = __gnu_cxx::
                      __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
                      ::operator*(&local_cf8);
            local_d08 = *ppSVar8;
            std::
            vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
            ::
            emplace_back<slang::analysis::AnalysisContext&,slang::ast::TimingControl_const*&,slang::analysis::AnalyzedProcedure&,slang::ast::Statement_const&,slang::ast::Symbol_const*&>
                      (in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170
                       ,(AnalyzedProcedure *)
                        CONCAT17(in_stack_fffffffffffff16f,in_stack_fffffffffffff168),
                       (Statement *)in_stack_fffffffffffff160,
                       (Symbol **)
                       CONCAT17(in_stack_fffffffffffff15f,
                                CONCAT16(in_stack_fffffffffffff15e,
                                         CONCAT15(in_stack_fffffffffffff15d,
                                                  CONCAT14(in_stack_fffffffffffff15c,
                                                           in_stack_fffffffffffff158)))));
            __gnu_cxx::
            __normal_iterator<const_slang::ast::Symbol_*const_*,_std::span<const_slang::ast::Symbol_*const,_18446744073709551615UL>_>
            ::operator++(&local_cf8);
          }
        }
        else {
          local_d10 = 0;
          std::
          vector<slang::analysis::AnalyzedAssertion,std::allocator<slang::analysis::AnalyzedAssertion>>
          ::
          emplace_back<slang::analysis::AnalysisContext&,slang::ast::TimingControl_const*&,slang::analysis::AnalyzedProcedure&,slang::ast::Statement_const&,decltype(nullptr)>
                    (in_stack_fffffffffffff180,in_stack_fffffffffffff178,in_stack_fffffffffffff170,
                     (AnalyzedProcedure *)
                     CONCAT17(in_stack_fffffffffffff16f,in_stack_fffffffffffff168),
                     (Statement *)in_stack_fffffffffffff160,
                     (void **)CONCAT17(in_stack_fffffffffffff15f,
                                       CONCAT16(in_stack_fffffffffffff15e,
                                                CONCAT15(in_stack_fffffffffffff15d,
                                                         CONCAT14(in_stack_fffffffffffff15c,
                                                                  in_stack_fffffffffffff158)))));
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>_*,_std::span<const_std::variant<const_slang::ast::Statement_*,_const_slang::ast::Expression_*>,_18446744073709551615UL>_>
      ::operator++(&local_cc8);
    }
    if (in_RDI[2].ptr == (Symbol *)0x0) {
      local_d38 = DataFlowAnalysis::getSampledValueCalls((DataFlowAnalysis *)0x814ae3);
      local_d28 = &local_d38;
      local_d40._M_current =
           (CallExpression **)
           std::span<const_slang::ast::CallExpression_*const,_18446744073709551615UL>::begin
                     ((span<const_slang::ast::CallExpression_*const,_18446744073709551615UL> *)
                      in_stack_fffffffffffff148);
      std::span<const_slang::ast::CallExpression_*const,_18446744073709551615UL>::end
                ((span<const_slang::ast::CallExpression_*const,_18446744073709551615UL> *)
                 CONCAT17(in_stack_fffffffffffff15f,
                          CONCAT16(in_stack_fffffffffffff15e,
                                   CONCAT15(in_stack_fffffffffffff15d,
                                            CONCAT14(in_stack_fffffffffffff15c,
                                                     in_stack_fffffffffffff158)))));
      while( true ) {
        bVar1 = __gnu_cxx::
                operator==<const_slang::ast::CallExpression_*const_*,_std::span<const_slang::ast::CallExpression_*const,_18446744073709551615UL>_>
                          ((__normal_iterator<const_slang::ast::CallExpression_*const_*,_std::span<const_slang::ast::CallExpression_*const,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffff150,
                           (__normal_iterator<const_slang::ast::CallExpression_*const_*,_std::span<const_slang::ast::CallExpression_*const,_18446744073709551615UL>_>
                            *)in_stack_fffffffffffff148);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<const_slang::ast::CallExpression_*const_*,_std::span<const_slang::ast::CallExpression_*const,_18446744073709551615UL>_>
        ::operator*(&local_d40);
        ClockInference::checkSampledValueFuncs
                  (in_stack_fffffffffffff160,
                   (Symbol *)
                   CONCAT17(in_stack_fffffffffffff15f,
                            CONCAT16(in_stack_fffffffffffff15e,
                                     CONCAT15(in_stack_fffffffffffff15d,
                                              CONCAT14(in_stack_fffffffffffff15c,
                                                       in_stack_fffffffffffff158)))),
                   (Expression *)in_stack_fffffffffffff150);
        __gnu_cxx::
        __normal_iterator<const_slang::ast::CallExpression_*const_*,_std::span<const_slang::ast::CallExpression_*const,_18446744073709551615UL>_>
        ::operator++(&local_d40);
      }
    }
  }
  if (local_18->kind == ProceduralBlock) {
    pPVar9 = ast::Symbol::as<slang::ast::ProceduralBlockSymbol>((Symbol *)0x814bc6);
    if (pPVar9->procedureKind == AlwaysComb) {
      DataFlowAnalysis::
      visitLatches<slang::analysis::AnalyzedProcedure::AnalyzedProcedure(slang::analysis::AnalysisContext&,slang::ast::Symbol_const&,slang::analysis::AnalyzedProcedure_const*)::__0>
                (in_stack_fffffffffffff3c0,in_stack_fffffffffffff3b8);
    }
  }
  else if (local_18->kind == Subroutine) {
    pSVar10 = ast::Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x814c4c);
    pSVar13 = pSVar10;
    uVar2 = DataFlowAnalysis::isReachable((DataFlowAnalysis *)0x814c6d);
    code = SUB84((ulong)pSVar13 >> 0x20,0);
    if (((bool)uVar2) && (pSVar10->subroutineKind == Function)) {
      this_00 = (AnalysisContext *)
                ast::SubroutineSymbol::getReturnType((SubroutineSymbol *)0x814ca2);
      uVar3 = ast::Type::isVoid((Type *)0x814cb3);
      if (!(bool)uVar3) {
        bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                          (&(pSVar10->super_Symbol).name);
        if (!bVar1) {
          uVar4 = DataFlowAnalysis::isDefinitelyAssigned
                            (in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c0);
          if (!(bool)uVar4) {
            uVar5 = DataFlowAnalysis::hasReturnStatements(in_stack_fffffffffffff150);
            if (!(bool)uVar5) {
              in_stack_fffffffffffff15c =
                   DataFlowAnalysis::isReferenced
                             ((DataFlowAnalysis *)in_stack_fffffffffffff1d0,
                              (ValueSymbol *)in_stack_fffffffffffff1c8);
              if (!(bool)in_stack_fffffffffffff15c) {
                location_00._7_1_ = uVar2;
                location_00._0_7_ = in_stack_fffffffffffff168;
                AnalysisContext::addDiag
                          (this_00,(Symbol *)
                                   CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,CONCAT14(
                                                  in_stack_fffffffffffff15c,
                                                  in_stack_fffffffffffff158)))),code,location_00);
                arg_00._M_len._7_1_ = in_stack_fffffffffffff19f;
                arg_00._M_len._0_7_ = in_stack_fffffffffffff198;
                arg_00._M_str = (char *)sVar12._M_extent._M_extent_value._M_extent_value;
                Diagnostic::operator<<(in_stack_fffffffffffff190,arg_00);
                goto LAB_00814e5d;
              }
            }
            location._7_1_ = uVar2;
            location._0_7_ = in_stack_fffffffffffff168;
            in_stack_fffffffffffff150 =
                 (DataFlowAnalysis *)
                 AnalysisContext::addDiag
                           (this_00,(Symbol *)
                                    CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,CONCAT14(
                                                  in_stack_fffffffffffff15c,
                                                  in_stack_fffffffffffff158)))),code,location);
            arg._M_len._7_1_ = in_stack_fffffffffffff19f;
            arg._M_len._0_7_ = in_stack_fffffffffffff198;
            arg._M_str = (char *)sVar12._M_extent._M_extent_value._M_extent_value;
            Diagnostic::operator<<(in_stack_fffffffffffff190,arg);
          }
        }
      }
    }
  }
LAB_00814e5d:
  local_c78 = 0;
LAB_00814e68:
  DataFlowAnalysis::~DataFlowAnalysis(in_stack_fffffffffffff150);
  return;
}

Assistant:

AnalyzedProcedure::AnalyzedProcedure(AnalysisContext& context, const Symbol& analyzedSymbol,
                                     const AnalyzedProcedure* parentProcedure) :
    analyzedSymbol(&analyzedSymbol), parentProcedure(parentProcedure) {

    DataFlowAnalysis dfa(context, analyzedSymbol, true);
    switch (analyzedSymbol.kind) {
        case SymbolKind::ProceduralBlock:
            dfa.run(analyzedSymbol.as<ProceduralBlockSymbol>().getBody());
            break;
        case SymbolKind::Subroutine:
            dfa.run(analyzedSymbol.as<SubroutineSymbol>().getBody());
            break;
        default:
            SLANG_UNREACHABLE;
    }

    if (dfa.bad)
        return;

    if (parentProcedure || !dfa.getAssertions().empty() || !dfa.getSampledValueCalls().empty()) {
        // All flavors of always and initial blocks can infer a clock.
        if (analyzedSymbol.kind == SymbolKind::ProceduralBlock &&
            analyzedSymbol.as<ProceduralBlockSymbol>().procedureKind !=
                ProceduralBlockKind::Final) {
            inferredClock = dfa.inferClock(parentProcedure);
        }

        // If no procedural inferred clock, check the scope for a default clocking block.
        if (!inferredClock) {
            auto scope = analyzedSymbol.getParentScope();
            SLANG_ASSERT(scope);

            if (auto defaultClocking = scope->getCompilation().getDefaultClocking(*scope))
                inferredClock = &defaultClocking->as<ClockingBlockSymbol>().getEvent();
        }

        if (inferredClock && inferredClock->bad())
            return;

        for (auto& var : dfa.getAssertions()) {
            if (auto stmtPtr = std::get_if<const Statement*>(&var)) {
                auto& stmt = **stmtPtr;
                if (stmt.kind == StatementKind::ProceduralChecker) {
                    for (auto inst : stmt.as<ProceduralCheckerStatement>().instances)
                        assertions.emplace_back(context, inferredClock, *this, stmt, inst);
                }
                else {
                    assertions.emplace_back(context, inferredClock, *this, stmt, nullptr);
                }
            }
            else {
                auto& expr = *std::get<const Expression*>(var);
                assertions.emplace_back(context, inferredClock, this, analyzedSymbol, expr);
            }
        }

        // If we have no inferred clock then all sampled value system calls must provide
        // a clocking argument explicitly.
        if (!inferredClock) {
            for (auto call : dfa.getSampledValueCalls())
                ClockInference::checkSampledValueFuncs(context, analyzedSymbol, *call);
        }
    }

    if (analyzedSymbol.kind == SymbolKind::ProceduralBlock) {
        auto& procedure = analyzedSymbol.as<ProceduralBlockSymbol>();
        if (procedure.procedureKind == ProceduralBlockKind::AlwaysComb) {
            dfa.visitLatches([&](const Symbol&, const Expression& expr) {
                FormatBuffer buffer;
                stringifyLSP(expr, dfa.getEvalContext(), buffer);

                context.addDiag(procedure, diag::InferredLatch, expr.sourceRange) << buffer.str();
            });
        }
    }
    else if (analyzedSymbol.kind == SymbolKind::Subroutine) {
        // Diagnose missing return statements and/or incomplete
        // assignments to the return value var.
        auto& subroutine = analyzedSymbol.as<SubroutineSymbol>();
        if (dfa.isReachable() && subroutine.subroutineKind == SubroutineKind::Function &&
            !subroutine.getReturnType().isVoid() && !subroutine.name.empty()) {

            // Control falls off the end of a non-void function but that is
            // fine if the return value var is definitely assigned here.
            SLANG_ASSERT(subroutine.returnValVar);
            if (!dfa.isDefinitelyAssigned(*subroutine.returnValVar)) {
                if (dfa.hasReturnStatements() || dfa.isReferenced(*subroutine.returnValVar)) {
                    context.addDiag(subroutine, diag::IncompleteReturn, subroutine.location)
                        << subroutine.name;
                }
                else {
                    context.addDiag(subroutine, diag::MissingReturn, subroutine.location)
                        << subroutine.name;
                }
            }
        }
    }
}